

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbpl_fifo.h
# Opt level: O1

int __thiscall
sbpl_fifo<sbpl_bfs_2d::bfs_cell_2d>::remove
          (sbpl_fifo<sbpl_bfs_2d::bfs_cell_2d> *this,char *__filename)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = this->head_;
  iVar2 = this->tail_;
  if (iVar1 == iVar2) {
    iVar3 = puts("ERROR: Trying to remove when FIFO is empty!");
  }
  else {
    *(bfs_cell_2d *)__filename = this->q_[iVar2];
    iVar3 = this->tail_ + 1;
    iVar4 = 0;
    if (iVar3 != this->size_) {
      iVar4 = iVar3;
    }
    this->tail_ = iVar4;
  }
  return CONCAT31((int3)((uint)iVar3 >> 8),iVar1 != iVar2);
}

Assistant:

bool remove(T* val)
    {
        if (head_ == tail_) {
            printf("ERROR: Trying to remove when FIFO is empty!\n");
            return false;
        }
        *val = q_[tail_];
        tail_++;
        if (tail_ == size_) tail_ = 0;
        return true;
    }